

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O0

EMoveResult __thiscall
sector_t::MoveFloor(sector_t *this,double speed,double dest,int crush,int direction,bool hexencrush)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double move;
  double movedest;
  double lastpos;
  bool flag;
  bool hexencrush_local;
  int direction_local;
  int crush_local;
  double dest_local;
  double speed_local;
  sector_t_conflict *this_local;
  
  dVar2 = secplane_t::fD(&this->floorplane);
  if (direction == -1) {
    dVar3 = secplane_t::GetChangedHeight(&this->floorplane,-speed);
    if (dest <= dVar3) {
      dVar3 = secplane_t::HeightDiff(&this->floorplane,dVar2,dest);
      bVar1 = MoveAttached(this,crush,dVar3,0,true);
      if (!bVar1) {
        return crushed;
      }
      secplane_t::setD(&this->floorplane,dest);
      bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,dVar3,0,false);
      if (bVar1) {
        secplane_t::setD(&this->floorplane,dVar2);
        P_ChangeSector((sector_t_conflict *)this,crush,-dVar3,0,true);
        MoveAttached(this,crush,-dVar3,0,false);
      }
      else {
        ChangePlaneTexZ(this,0,dVar3);
        AdjustFloorClip(this);
      }
      return pastdest;
    }
    bVar1 = MoveAttached(this,crush,-speed,0,true);
    if (!bVar1) {
      return crushed;
    }
    secplane_t::setD(&this->floorplane,dVar3);
    bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,-speed,0,false);
    if (bVar1) {
      secplane_t::setD(&this->floorplane,dVar2);
      P_ChangeSector((sector_t_conflict *)this,crush,speed,0,true);
      MoveAttached(this,crush,speed,0,false);
      return crushed;
    }
    dVar2 = secplane_t::HeightDiff(&this->floorplane,dVar2);
    ChangePlaneTexZ(this,0,dVar2);
    AdjustFloorClip(this);
  }
  else if (direction == 1) {
    bVar1 = secplane_t::isSlope(&this->ceilingplane);
    _direction_local = dest;
    if ((((!bVar1) && (bVar1 = secplane_t::isSlope(&this->floorplane), !bVar1)) &&
        (bVar1 = PortalIsLinked(this,1), !bVar1)) &&
       (((i_compatflags2 & 2U) == 0 && (dVar3 = secplane_t::fD(&this->ceilingplane), dVar3 < -dest))
       )) {
      _direction_local = secplane_t::fD(&this->ceilingplane);
      _direction_local = -_direction_local;
    }
    dVar3 = secplane_t::GetChangedHeight(&this->floorplane,speed);
    if (dVar3 <= _direction_local) {
      dVar3 = secplane_t::HeightDiff(&this->floorplane,dVar2,_direction_local);
      bVar1 = MoveAttached(this,crush,dVar3,0,true);
      if (!bVar1) {
        return crushed;
      }
      secplane_t::setD(&this->floorplane,_direction_local);
      bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,dVar3,0,false);
      if (bVar1) {
        secplane_t::setD(&this->floorplane,dVar2);
        P_ChangeSector((sector_t_conflict *)this,crush,-dVar3,0,true);
        MoveAttached(this,crush,-dVar3,0,false);
      }
      else {
        ChangePlaneTexZ(this,0,dVar3);
        AdjustFloorClip(this);
      }
      return pastdest;
    }
    bVar1 = MoveAttached(this,crush,speed,0,true);
    if (!bVar1) {
      return crushed;
    }
    secplane_t::setD(&this->floorplane,dVar3);
    bVar1 = P_ChangeSector((sector_t_conflict *)this,crush,speed,0,false);
    if (bVar1) {
      if ((-1 < crush) && (!hexencrush)) {
        dVar2 = secplane_t::HeightDiff(&this->floorplane,dVar2);
        ChangePlaneTexZ(this,0,dVar2);
        AdjustFloorClip(this);
        return crushed;
      }
      secplane_t::setD(&this->floorplane,dVar2);
      P_ChangeSector((sector_t_conflict *)this,crush,-speed,0,true);
      MoveAttached(this,crush,-speed,0,false);
      return crushed;
    }
    dVar2 = secplane_t::HeightDiff(&this->floorplane,dVar2);
    ChangePlaneTexZ(this,0,dVar2);
    AdjustFloorClip(this);
  }
  return ok;
}

Assistant:

EMoveResult sector_t::MoveFloor(double speed, double dest, int crush, int direction, bool hexencrush)
{
	bool	 	flag;
	double 	lastpos;
	double		movedest;
	double		move;
	//double		destheight;	//jff 02/04/98 used to keep floors/ceilings
							// from moving thru each other
	lastpos = floorplane.fD();
	switch (direction)
	{
	case -1:
		// DOWN
		movedest = floorplane.GetChangedHeight(-speed);
		if (movedest >= dest)
		{
			move = floorplane.HeightDiff(lastpos, dest);

			if (!MoveAttached(crush, move, 0, true)) return EMoveResult::crushed;

			floorplane.setD(dest);
			flag = P_ChangeSector(this, crush, move, 0, false);
			if (flag)
			{
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, -move, 0, true);
				MoveAttached(crush, -move, 0, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::floor, move);
				AdjustFloorClip();
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, -speed, 0, true)) return EMoveResult::crushed;

			floorplane.setD(movedest);

			flag = P_ChangeSector(this, crush, -speed, 0, false);
			if (flag)
			{
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, speed, 0, true);
				MoveAttached(crush, speed, 0, false);
				return EMoveResult::crushed;
			}
			else
			{
				ChangePlaneTexZ(sector_t::floor, floorplane.HeightDiff(lastpos));
				AdjustFloorClip();
			}
		}
		break;

	case 1:
		// UP
		// jff 02/04/98 keep floor from moving thru ceilings
		// [RH] not so easy with arbitrary planes
		//destheight = (dest < ceilingheight) ? dest : ceilingheight;
		if (!ceilingplane.isSlope() && !floorplane.isSlope() &&
			!PortalIsLinked(sector_t::ceiling) &&
			(!(i_compatflags2 & COMPATF2_FLOORMOVE) && -dest > ceilingplane.fD()))
		{
			dest = -ceilingplane.fD();
		}

		movedest = floorplane.GetChangedHeight(speed);

		if (movedest <= dest)
		{
			move = floorplane.HeightDiff(lastpos, dest);

			if (!MoveAttached(crush, move, 0, true)) return EMoveResult::crushed;

			floorplane.setD(dest);

			flag = P_ChangeSector(this, crush, move, 0, false);
			if (flag)
			{
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, -move, 0, true);
				MoveAttached(crush, -move, 0, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::floor, move);
				AdjustFloorClip();
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, speed, 0, true)) return EMoveResult::crushed;

			floorplane.setD(movedest);

			// COULD GET CRUSHED
			flag = P_ChangeSector(this, crush, speed, 0, false);
			if (flag)
			{
				if (crush >= 0 && !hexencrush)
				{
					ChangePlaneTexZ(sector_t::floor, floorplane.HeightDiff(lastpos));
					AdjustFloorClip();
					return EMoveResult::crushed;
				}
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, -speed, 0, true);
				MoveAttached(crush, -speed, 0, false);
				return EMoveResult::crushed;
			}
			ChangePlaneTexZ(sector_t::floor, floorplane.HeightDiff(lastpos));
			AdjustFloorClip();
		}
		break;
	}
	return EMoveResult::ok;
}